

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

float __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,float,duckdb::QuantileIndirect<float>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<float> *accessor)

{
  RESULT_TYPE_conflict3 RVar1;
  float fVar2;
  Vector *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  RVar1 = QuantileIndirect<float>::operator()
                    ((QuantileIndirect<float> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (INPUT_TYPE *)in_stack_ffffffffffffffc8);
  fVar2 = CastInterpolation::Cast<float,float>
                    ((float *)CONCAT44(RVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  return fVar2;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}